

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O2

void model_skip_for_sb_y_large
               (AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,MACROBLOCK *x,MACROBLOCKD *xd,
               RD_STATS *rd_stats,int *early_term,int calculate_rd,int64_t best_sse,uint *var_output
               ,uint var_prune_threshold)

{
  long lVar1;
  INTER_SEARCH_EARLY_TERM_IDX IVar2;
  MB_MODE_INFO *pMVar3;
  char cVar4;
  uint uVar5;
  int sum_00;
  byte bVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  uint *var_tx;
  byte bVar11;
  uint uVar12;
  uint32_t *puVar13;
  long lVar14;
  uint32_t *puVar15;
  ulong uVar16;
  long lVar17;
  BLOCK_SIZE bsize_00;
  uint *sse_tx;
  long lVar18;
  uint uVar19;
  long lVar20;
  int *piVar21;
  bool bVar22;
  uint in_stack_fffffffffffff138;
  uint8_t *local_ec0;
  uint8_t *local_e98;
  uint sse;
  ulong local_e88;
  ulong local_e80;
  ulong local_e78;
  long local_e70;
  int local_e68;
  int sum;
  MACROBLOCKD *local_e60;
  ulong local_e58;
  long local_e50;
  long local_e48;
  ulong local_e40;
  int sum_1;
  uint var16x16 [64];
  uint var8x8 [256];
  uint sse8x8 [256];
  int sum8x8 [256];
  
  if (x->force_zeromv_skip_for_blk != 0) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    return;
  }
  local_e68 = mi_col;
  local_e60 = xd;
  if ((bsize < BLOCK_32X64) || ((x->txfm_search_params).tx_mode_search_type == '\0')) {
    bVar11 = ""[bsize];
    bVar6 = ""[bsize];
    memset(sse8x8,0,0x400);
    memset(sum8x8,0,0x400);
    memset(var8x8,0,0x400);
    local_e98 = x->plane[0].src.buf;
    iVar7 = x->plane[0].src.stride;
    local_ec0 = xd->plane[0].dst.buf;
    local_e78 = (ulong)xd->plane[0].dst.stride;
    sse = 0;
    sum = 0;
    local_e70 = (long)(4 << (bVar11 & 0x1f));
    local_e48 = (long)(4 << (bVar6 & 0x1f));
    local_e50 = local_e78 << 3;
    local_e58 = (long)iVar7 << 3;
    lVar20 = 0;
    uVar16 = 0;
    local_e88 = (ulong)bVar11;
    local_e40 = (ulong)bVar6;
    while (uVar5 = sse, (long)uVar16 < local_e48) {
      lVar20 = (long)(int)lVar20;
      puVar13 = var8x8 + lVar20;
      piVar21 = sum8x8 + lVar20;
      puVar15 = sse8x8 + lVar20;
      local_e80 = uVar16;
      for (lVar14 = 0; lVar14 < local_e70; lVar14 = lVar14 + 0x20) {
        (*aom_get_var_sse_sum_8x8_quad)
                  (local_e98 + lVar14,iVar7,local_ec0 + lVar14,(int)local_e78,puVar15,piVar21,&sse,
                   &sum,puVar13);
        lVar20 = lVar20 + 4;
        puVar13 = puVar13 + 4;
        piVar21 = piVar21 + 4;
        puVar15 = puVar15 + 4;
      }
      local_ec0 = local_ec0 + local_e50;
      local_e98 = local_e98 + local_e58;
      uVar16 = local_e80 + 8;
    }
    local_e70 = (long)sum;
    cVar4 = (char)local_e40 + (char)local_e88;
    uVar16 = (ulong)sse;
    uVar19 = sse - (int)((ulong)(local_e70 * local_e70) >> (cVar4 + 4U & 0x3f));
    local_e78 = (ulong)uVar19;
    if ((var_output != (uint *)0x0) && (*var_output = uVar19, var_prune_threshold < uVar19)) {
      return;
    }
    rd_stats->sse = uVar16;
    *early_term = 0;
    bVar6 = calculate_tx_size(cpi,bsize,x,uVar19,sse,early_term);
    bVar11 = bVar6;
    if (bVar6 < 2) {
      bVar11 = 1;
    }
    pMVar3 = *local_e60->mi;
    pMVar3->tx_size = bVar11;
    if ((calculate_rd == 0) &&
       (IVar2 = (cpi->sf).rt_sf.sse_early_term_inter_search, IVar2 != EARLY_TERM_DISABLED)) {
      iVar7 = early_term_inter_search_with_sse(IVar2,bsize,uVar16,best_sse,pMVar3->mode);
      bVar22 = iVar7 != 0;
    }
    else {
      bVar22 = false;
    }
    if ((*early_term != 0) || (bVar22)) {
      bsize_00 = (BLOCK_SIZE)uVar5;
    }
    else {
      uVar8 = 0;
      memset(&sum_1,0,0x100);
      memset(var16x16,0,0x100);
      uVar19 = 1 << (cVar4 - 2U & 0x1f);
      uVar16 = (ulong)uVar19;
      if (bVar6 < 2) {
        sse_tx = sse8x8;
        var_tx = var8x8;
      }
      else {
        uVar12 = (int)local_e88 - 1;
        local_e88 = (ulong)uVar12;
        bVar11 = (byte)uVar12;
        lVar20 = 0;
        for (; (int)uVar8 < 1 << ((char)local_e40 - 1U & 0x1f); uVar8 = uVar8 + 2) {
          lVar18 = (long)(int)((uVar8 | 1) << (bVar11 & 0x1f));
          lVar9 = (long)(int)(uVar8 << (bVar11 & 0x1f));
          lVar20 = (long)(int)lVar20;
          lVar14 = lVar20 * 4;
          lVar1 = lVar20 * 4;
          for (lVar10 = 0; lVar10 < 1 << (bVar11 & 0x1f); lVar10 = lVar10 + 2) {
            iVar7 = sse8x8[lVar9 + lVar10 + 1] + sse8x8[lVar9 + lVar10] + sse8x8[lVar18 + lVar10] +
                    sse8x8[lVar18 + lVar10 + 1];
            *(int *)((long)&sum_1 + lVar10 * 2 + lVar1) = iVar7;
            lVar17 = (long)sum8x8[lVar18 + lVar10 + 1] + (long)sum8x8[lVar18 + lVar10] +
                     (long)sum8x8[lVar9 + lVar10 + 1] + (long)sum8x8[lVar9 + lVar10];
            *(int *)((long)var16x16 + lVar10 * 2 + lVar14) =
                 iVar7 - (int)((ulong)(lVar17 * lVar17) >> 8);
            lVar20 = lVar20 + 1;
          }
        }
        uVar19 = uVar19 >> 2;
        sse_tx = (uint *)&sum_1;
        var_tx = var16x16;
        local_e80 = uVar16;
      }
      set_early_term_based_on_uv_plane
                (cpi,x,bsize,local_e60,mi_row,local_e68,early_term,uVar19,sse_tx,var_tx,
                 (int)local_e70,(uint)local_e78,uVar5);
      bsize_00 = (BLOCK_SIZE)sse;
    }
    goto LAB_002020e3;
  }
  (*xd->mi)->tx_size = '\x02';
  bVar11 = ""[bsize];
  bVar6 = ""[bsize];
  memset(sse8x8,0,0x100);
  memset(sum8x8,0,0x100);
  local_e98 = x->plane[0].src.buf;
  iVar7 = x->plane[0].src.stride;
  local_ec0 = xd->plane[0].dst.buf;
  local_e70 = (long)xd->plane[0].dst.stride;
  local_e88 = CONCAT44(local_e88._4_4_,(uint)bVar11);
  var8x8[0] = 0;
  sum_1 = 0;
  local_e80 = (ulong)(4 << (bVar6 & 0x1f));
  local_e48 = local_e70 << 4;
  local_e50 = (long)iVar7 << 4;
  lVar20 = 0;
  uVar16 = 0;
  local_e58 = (ulong)bVar6;
  while (uVar5 = var8x8[0], sum_00 = sum_1, (long)uVar16 < (long)local_e80) {
    lVar20 = (long)(int)lVar20;
    puVar13 = (uint32_t *)(sum8x8 + lVar20);
    puVar15 = sse8x8 + lVar20;
    local_e78 = uVar16;
    for (lVar14 = 0; lVar14 < 4 << (bVar11 & 0x1f); lVar14 = lVar14 + 0x20) {
      (*aom_get_var_sse_sum_16x16_dual)
                (local_e98 + lVar14,iVar7,local_ec0 + lVar14,(int)local_e70,puVar15,var8x8,&sum_1,
                 puVar13);
      lVar20 = lVar20 + 2;
      puVar13 = puVar13 + 2;
      puVar15 = puVar15 + 2;
    }
    local_ec0 = local_ec0 + local_e48;
    local_e98 = local_e98 + local_e50;
    uVar16 = local_e78 + 0x10;
  }
  cVar4 = (char)local_e58 + (char)local_e88;
  uVar16 = (ulong)var8x8[0];
  uVar19 = var8x8[0] - (int)((ulong)((long)sum_1 * (long)sum_1) >> (cVar4 + 4U & 0x3f));
  if ((var_output != (uint *)0x0) && (*var_output = uVar19, var_prune_threshold < uVar19)) {
    return;
  }
  rd_stats->sse = uVar16;
  *early_term = 0;
  if ((x->txfm_search_params).tx_mode_search_type == '\x02') {
    if ((cpi->sf).rt_sf.tx_size_level_based_on_qstep < 2) {
LAB_00201dca:
      bVar11 = 0;
    }
    else {
      iVar7 = (int)x->plane[0].dequant_QTX[1] >> ((char)(x->e_mbd).bd - 5U & 0x1f);
      uVar8 = iVar7 * iVar7;
      if (var8x8[0] < uVar8) {
        if (((uVar8 <= x->source_variance) || (x->color_sensitivity[0] != '\0')) ||
           (x->color_sensitivity[1] != '\0')) goto LAB_00201dca;
        *early_term = 1;
        bVar11 = 1;
      }
      else {
        bVar11 = 0;
      }
    }
  }
  else {
    bVar11 = 0;
  }
  if ((calculate_rd == 0) &&
     (IVar2 = (cpi->sf).rt_sf.sse_early_term_inter_search, IVar2 != EARLY_TERM_DISABLED)) {
    iVar7 = early_term_inter_search_with_sse(IVar2,bsize,uVar16,best_sse,(*local_e60->mi)->mode);
    bVar22 = iVar7 != 0;
  }
  else {
    bVar22 = false;
  }
  if (!(bool)(bVar11 | bVar22)) {
    set_early_term_based_on_uv_plane
              (cpi,x,bsize,local_e60,mi_row,local_e68,early_term,(1 << (cVar4 - 2U & 0x1f)) >> 2,
               sse8x8,(uint *)sum8x8,sum_00,uVar19,uVar5);
    uVar16 = (ulong)var8x8[0];
  }
  bsize_00 = (BLOCK_SIZE)uVar16;
LAB_002020e3:
  calc_rate_dist_block_param
            ((AV1_COMP *)x,(MACROBLOCK *)rd_stats,(RD_STATS *)(ulong)(uint)calculate_rd,
             (int)early_term,(int *)(ulong)bsize,bsize_00,in_stack_fffffffffffff138);
  return;
}

Assistant:

static void model_skip_for_sb_y_large(AV1_COMP *cpi, BLOCK_SIZE bsize,
                                      int mi_row, int mi_col, MACROBLOCK *x,
                                      MACROBLOCKD *xd, RD_STATS *rd_stats,
                                      int *early_term, int calculate_rd,
                                      int64_t best_sse,
                                      unsigned int *var_output,
                                      unsigned int var_prune_threshold) {
  if (x->force_zeromv_skip_for_blk) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    return;
  }

  // For block sizes greater than 32x32, the transform size is always 16x16.
  // This function avoids calling calculate_variance() for tx_size 16x16 cases
  // by directly populating variance at tx_size level from
  // block_variance_16x16_dual() function.
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  if (CAP_TX_SIZE_FOR_BSIZE_GT32(txfm_params->tx_mode_search_type, bsize)) {
    xd->mi[0]->tx_size = TX_SIZE_FOR_BSIZE_GT32;
    model_skip_for_sb_y_large_64(cpi, bsize, mi_row, mi_col, x, xd, rd_stats,
                                 early_term, calculate_rd, best_sse, var_output,
                                 var_prune_threshold);
    return;
  }

  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  unsigned int sse;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  int test_skip = 1;
  unsigned int var;
  int sum;

  const int bw = b_width_log2_lookup[bsize];
  const int bh = b_height_log2_lookup[bsize];
  unsigned int sse8x8[256] = { 0 };
  int sum8x8[256] = { 0 };
  unsigned int var8x8[256] = { 0 };
  TX_SIZE tx_size;

  // Calculate variance for whole partition, and also save 8x8 blocks' variance
  // to be used in following transform skipping test.
  block_variance(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride,
                 4 << bw, 4 << bh, &sse, &sum, 8, sse8x8, sum8x8, var8x8);
  var = sse - (unsigned int)(((int64_t)sum * sum) >> (bw + bh + 4));
  if (var_output) {
    *var_output = var;
    if (*var_output > var_prune_threshold) {
      return;
    }
  }

  rd_stats->sse = sse;
  // Skipping test
  *early_term = 0;
  tx_size = calculate_tx_size(cpi, bsize, x, var, sse, early_term);
  assert(tx_size <= TX_16X16);
  // The code below for setting skip flag assumes transform size of at least
  // 8x8, so force this lower limit on transform.
  if (tx_size < TX_8X8) tx_size = TX_8X8;
  xd->mi[0]->tx_size = tx_size;

  MB_MODE_INFO *const mi = xd->mi[0];
  if (!calculate_rd && cpi->sf.rt_sf.sse_early_term_inter_search &&
      early_term_inter_search_with_sse(
          cpi->sf.rt_sf.sse_early_term_inter_search, bsize, sse, best_sse,
          mi->mode))
    test_skip = 0;

  if (*early_term) test_skip = 0;

  // Evaluate if the partition block is a skippable block in Y plane.
  if (test_skip) {
    unsigned int sse16x16[64] = { 0 };
    int sum16x16[64] = { 0 };
    unsigned int var16x16[64] = { 0 };
    const unsigned int *sse_tx = sse8x8;
    const unsigned int *var_tx = var8x8;
    unsigned int num_blks = 1 << (bw + bh - 2);

    if (tx_size >= TX_16X16) {
      calculate_variance(bw, bh, TX_8X8, sse8x8, sum8x8, var16x16, sse16x16,
                         sum16x16);
      sse_tx = sse16x16;
      var_tx = var16x16;
      num_blks = num_blks >> 2;
    }
    set_early_term_based_on_uv_plane(cpi, x, bsize, xd, mi_row, mi_col,
                                     early_term, num_blks, sse_tx, var_tx, sum,
                                     var, sse);
  }
  calc_rate_dist_block_param(cpi, x, rd_stats, calculate_rd, early_term, bsize,
                             sse);
}